

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O2

void __thiscall Belief::Belief(Belief *this,StateDistribution *belief)

{
  *(undefined ***)this = &PTR__Belief_00602160;
  (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_b).super_StateDistribution._vptr_StateDistribution =
       (_func_int **)&PTR__StateDistributionVector_005d38d8;
  Set(this,belief);
  return;
}

Assistant:

Belief::Belief(const StateDistribution& belief)
{
    this->Set(belief);
}